

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Gia_Man_t * Acb_NtkDeriveMiterCnfInter(Gia_Man_t *p,int iTar,int nTars)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  
  pGVar1 = Gia_ManDup(p);
  if (0 < iTar) {
    iVar3 = -nTars;
    iVar4 = iTar;
    do {
      pGVar2 = Gia_ManDupUniv(pGVar1,pGVar1->vCis->nSize + iVar3);
      if (pGVar2->vCis->nSize != pGVar1->vCis->nSize) {
        __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x9a4,"Gia_Man_t *Acb_NtkDeriveMiterCnfInter(Gia_Man_t *, int, int)");
      }
      Gia_ManStop(pGVar1);
      pGVar1 = Acb_NtkEcoSynthesize(pGVar2);
      Gia_ManStop(pGVar2);
      iVar3 = iVar3 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  pGVar2 = Gia_ManDupCofactorVar(pGVar1,(iTar - nTars) + pGVar1->vCis->nSize,0);
  Gia_ManStop(pGVar1);
  pGVar1 = Acb_NtkEcoSynthesize(pGVar2);
  Gia_ManStop(pGVar2);
  pGVar2 = Gia_ManDupRemovePis(pGVar1,nTars);
  Gia_ManStop(pGVar1);
  return pGVar2;
}

Assistant:

Gia_Man_t * Acb_NtkDeriveMiterCnfInter( Gia_Man_t * p, int iTar, int nTars )
{
    Gia_Man_t * pCof1, * pCof = Gia_ManDup( p ); int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );

        pCof = Acb_NtkEcoSynthesize( p = pCof );
        Gia_ManStop( p );
    }
    pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
    Gia_ManStop( pCof );

    pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
    Gia_ManStop( p );

    pCof1 = Gia_ManDupRemovePis( p = pCof1, nTars );
    Gia_ManStop( p );
    return pCof1;
}